

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O0

string * __thiscall
GrcManager::ProcessClassList_abi_cxx11_(GrcManager *this,RefAST *ast,RefAST *pastNext)

{
  int iVar1;
  AST *pAVar2;
  char *pcVar3;
  GdlGlyphClassDefn *this_00;
  AST *this_01;
  RefCount *in_RCX;
  RefCount<AST> *in_RDX;
  GrcManager *in_RSI;
  string *in_RDI;
  RefAST astGlyph;
  int nodetyp;
  GdlGlyphClassDefn *pglfc;
  Symbol psymClass;
  int nextNodeTyp;
  string *staClassName;
  GdlGlyphDefn **in_stack_000003c0;
  GlyphClassType in_stack_000003cc;
  GdlGlyphClassDefn *in_stack_000003d0;
  RefAST *in_stack_000003d8;
  GrcManager *in_stack_000003e0;
  GdlGlyphClassDefn *in_stack_fffffffffffffe68;
  undefined3 uVar4;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  AST *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  char cVar5;
  GrcSymbolTableEntry *in_stack_fffffffffffffe88;
  RefCount<AST> *in_stack_fffffffffffffe90;
  AST *in_stack_fffffffffffffe98;
  GrcSymbolTableEntry *in_stack_fffffffffffffeb8;
  RefCount<AST> local_e0;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  GrcSymbolTable *in_stack_ffffffffffffff30;
  allocator local_61;
  RefAST *in_stack_ffffffffffffffa0;
  GrcManager *in_stack_ffffffffffffffa8;
  RefCount<AST> local_40;
  int local_38;
  RefCount *local_20;
  
  local_20 = in_RCX;
  RefCount<AST>::operator->(in_RDX);
  iVar1 = AST::getType((AST *)0x2785fa);
  if (iVar1 == 0xd) {
    RefCount<AST>::operator->(in_RDX);
    AST::getNextSibling((AST *)in_stack_fffffffffffffe68);
    RefCount<AST>::operator=(in_stack_fffffffffffffe90,(RefCount<AST> *)in_stack_fffffffffffffe88);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    pAVar2 = RefCount::operator_cast_to_AST_(local_20);
    if (pAVar2 == (AST *)0x0) {
      RefCount<AST>::operator->(in_RDX);
      AST::getText_abi_cxx11_(in_stack_fffffffffffffe98);
      return in_RDI;
    }
    RefCount<AST>::operator->(in_RDX);
    AST::getNextSibling((AST *)in_stack_fffffffffffffe68);
    RefCount<AST>::operator->(&local_40);
    iVar1 = AST::getType((AST *)0x2786e4);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    local_38 = iVar1;
    if ((((iVar1 != 0xd) && (iVar1 != 0x1d)) && (iVar1 != 0x1f)) &&
       (((iVar1 != 0x1c && (iVar1 != 0x1e)) && (iVar1 != 0x1a)))) {
      RefCount<AST>::operator->(in_RDX);
      AST::getText_abi_cxx11_(in_stack_fffffffffffffe98);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,pcVar3,&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      return in_RDI;
    }
  }
  SymbolTable(in_RSI);
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             &in_stack_fffffffffffffe78->down);
  LineAndFile(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  GrcSymbolTable::AddAnonymousClassSymbol
            (in_stack_ffffffffffffff30,
             (GrpLineAndFile *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x27889a);
  RefCount<AST>::~RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffeb8);
  this_00 = GrcSymbolTableEntry::GlyphClassDefnData(in_stack_fffffffffffffe88);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff30,in_RDI);
  GdlGlyphClassDefn::SetName
            ((GdlGlyphClassDefn *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (string *)in_stack_fffffffffffffe68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  GdlRenderer::AddGlyphClass
            ((GdlRenderer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             &in_stack_fffffffffffffe78->down);
  while( true ) {
    pAVar2 = RefCount::operator_cast_to_AST_((RefCount *)&local_e0);
    cVar5 = '\0';
    if (pAVar2 != (AST *)0x0) {
      in_stack_fffffffffffffe78 = RefCount<AST>::operator->(&local_e0);
      in_stack_fffffffffffffe74 = AST::getType((AST *)0x2789b5);
      uVar4 = (undefined3)in_stack_fffffffffffffe70;
      in_stack_fffffffffffffe70 = CONCAT13(1,uVar4);
      if (((in_stack_fffffffffffffe74 != 0xd) &&
          (in_stack_fffffffffffffe70 = CONCAT13(1,uVar4), in_stack_fffffffffffffe74 != 0x1d)) &&
         ((in_stack_fffffffffffffe70 = CONCAT13(1,uVar4), in_stack_fffffffffffffe74 != 0x1f &&
          (((in_stack_fffffffffffffe70 = CONCAT13(1,uVar4), in_stack_fffffffffffffe74 != 0x1c &&
            (in_stack_fffffffffffffe70 = CONCAT13(1,uVar4), in_stack_fffffffffffffe74 != 0x65)) &&
           (in_stack_fffffffffffffe70 = CONCAT13(1,uVar4), in_stack_fffffffffffffe74 != 0x1e)))))) {
        in_stack_fffffffffffffe70 = CONCAT13(in_stack_fffffffffffffe74 == 0x1a,uVar4);
      }
      cVar5 = (char)((uint)in_stack_fffffffffffffe70 >> 0x18);
    }
    if (cVar5 == '\0') break;
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT17(cVar5,in_stack_fffffffffffffe80),
               &in_stack_fffffffffffffe78->down);
    ProcessGlyphClassMember
              (in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003cc,
               in_stack_000003c0);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    this_01 = RefCount<AST>::operator->(&local_e0);
    AST::getNextSibling(this_01);
    RefCount<AST>::operator=((RefCount<AST> *)this_00,&pAVar2->down);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  }
  RefCount<AST>::operator=((RefCount<AST> *)this_00,&pAVar2->down);
  RefCount<AST>::~RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  return in_RDI;
}

Assistant:

std::string GrcManager::ProcessClassList(RefAST ast, RefAST * pastNext)
{
	if (ast->getType() == IDENT)
	{
		*pastNext = ast->getNextSibling();
		//	If only one class in the list, just return its name.
		if (!*pastNext)
			return ast->getText();
		int nextNodeTyp = ast->getNextSibling()->getType();
		if (nextNodeTyp != IDENT && nextNodeTyp != LITERAL_glyphid &&
			nextNodeTyp != LITERAL_unicode && nextNodeTyp != LITERAL_codepoint &&
			nextNodeTyp != LITERAL_postscript && nextNodeTyp != LITERAL_pseudo)
		{
			return ast->getText().c_str();
		}
	}

	Symbol psymClass = SymbolTable()->AddAnonymousClassSymbol(LineAndFile(ast));

	std::string staClassName = psymClass->FullName();
	GdlGlyphClassDefn * pglfc = psymClass->GlyphClassDefnData();
	Assert(pglfc);
	pglfc->SetName(staClassName);
	m_prndr->AddGlyphClass(pglfc);

	int nodetyp;
	RefAST astGlyph = ast;
	while (astGlyph &&
		((nodetyp = astGlyph->getType()) == IDENT ||
			nodetyp == LITERAL_glyphid ||
			nodetyp == LITERAL_unicode || nodetyp == LITERAL_codepoint || nodetyp == ZuHex ||
			nodetyp == LITERAL_postscript || nodetyp == LITERAL_pseudo))
	{
		ProcessGlyphClassMember(astGlyph, pglfc, kglfctUnion, NULL);
		astGlyph = astGlyph->getNextSibling();
	}
	*pastNext = astGlyph;

	return staClassName;
}